

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Syndicated_Device_List.cpp
# Opt level: O0

object get_sequence_dev_list(SRUP_MSG_SYNDICATED_DEV_LIST *self)

{
  uint32_t *x;
  SRUP_MSG_SYNDICATED_DEV_LIST *in_RSI;
  uint32_t *rv;
  SRUP_MSG_SYNDICATED_DEV_LIST *self_local;
  
  x = SRUP_MSG_SYNDICATED_DEV_LIST::device_sequence(in_RSI);
  if (x == (uint32_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<unsigned_int>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_sequence_dev_list (SRUP_MSG_SYNDICATED_DEV_LIST &self)
{
    const uint32_t* rv;
    rv = self.device_sequence();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();
}